

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

void __thiscall Js::ScriptContext::CleanupWeakReferenceDictionaries(ScriptContext *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *ppIVar4;
  SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount> *pSVar5;
  Iterator local_40;
  
  if (this->isWeakReferenceDictionaryListCleared == false) {
    pSVar5 = &this->weakReferenceDictionaryList;
    local_40.list = pSVar5;
    local_40.current = &pSVar5->super_SListNodeBase<Memory::ArenaAllocator>;
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    while( true ) {
      if (pSVar5 == (SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount>
                     *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
        pSVar5 = (SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount> *
                 )local_40.current;
      }
      local_40.current = (pSVar5->super_SListNodeBase<Memory::ArenaAllocator>).next;
      if ((SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount> *)
          local_40.current == local_40.list) break;
      ppIVar4 = SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount>::
                Iterator::Data(&local_40);
      (**(*ppIVar4)->_vptr_IWeakReferenceDictionary)();
      pSVar5 = (SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount> *)
               local_40.current;
    }
  }
  return;
}

Assistant:

void ScriptContext::CleanupWeakReferenceDictionaries()
    {
        if (!isWeakReferenceDictionaryListCleared)
        {
            SListBase<JsUtil::IWeakReferenceDictionary*>::Iterator iter(&this->weakReferenceDictionaryList);

            while (iter.Next())
            {
                JsUtil::IWeakReferenceDictionary* weakReferenceDictionary = iter.Data();

                weakReferenceDictionary->Cleanup();
            }
        }
    }